

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * FindCVar(char *var_name,FBaseCVar **prev)

{
  int iVar1;
  char *__s1;
  undefined1 local_30 [8];
  FBaseCVar *dummy;
  FBaseCVar *var;
  FBaseCVar **prev_local;
  char *var_name_local;
  
  if (var_name == (char *)0x0) {
    var_name_local = (char *)0x0;
  }
  else {
    var = (FBaseCVar *)prev;
    if (prev == (FBaseCVar **)0x0) {
      var = (FBaseCVar *)local_30;
    }
    dummy = CVars;
    prev_local = (FBaseCVar **)var_name;
    var->_vptr_FBaseCVar = (_func_int **)0x0;
    for (; dummy != (FBaseCVar *)0x0; dummy = dummy->m_Next) {
      __s1 = FBaseCVar::GetName(dummy);
      iVar1 = strcasecmp(__s1,(char *)prev_local);
      if (iVar1 == 0) break;
      var->_vptr_FBaseCVar = (_func_int **)dummy;
    }
    var_name_local = (char *)dummy;
  }
  return (FBaseCVar *)var_name_local;
}

Assistant:

FBaseCVar *FindCVar (const char *var_name, FBaseCVar **prev)
{
	FBaseCVar *var;
	FBaseCVar *dummy;

	if (var_name == NULL)
		return NULL;

	if (prev == NULL)
		prev = &dummy;

	var = CVars;
	*prev = NULL;
	while (var)
	{
		if (stricmp (var->GetName (), var_name) == 0)
			break;
		*prev = var;
		var = var->m_Next;
	}
	return var;
}